

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall wasm_functype_t::~wasm_functype_t(wasm_functype_t *this)

{
  ~wasm_functype_t(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~wasm_functype_t() {
    wasm_valtype_vec_delete(&params);
    wasm_valtype_vec_delete(&results);
  }